

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_disks.cpp
# Opt level: O0

int benchmark_disks_alloc<foxxll::striping>
              (external_size_type size,external_size_type start_offset,size_t batch_size,
              size_t raw_block_size,string *optrw)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  int iVar3;
  pointer pBVar4;
  pointer pBVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  instance_pointer this;
  pointer ppuVar9;
  ulong uVar10;
  undefined8 *puVar11;
  Logger *pLVar12;
  value_type puVar13;
  reference ppuVar14;
  double *pdVar15;
  type count;
  size_type __n;
  instance_pointer this_00;
  reference pvVar16;
  ostream *poVar17;
  char *pcVar18;
  void *this_01;
  ulong uVar19;
  pointer this_02;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char *local_cc0;
  pointer local_ab8;
  pointer local_a88;
  size_t j_4;
  _Setprecision local_a78;
  _Setw local_a74;
  double local_a70;
  _Setprecision local_a68;
  _Setw local_a64;
  ulong local_a60;
  _Setw local_a54;
  Logger local_a50;
  LoggerVoidify local_8d1 [401];
  exception *ex;
  Logger local_720;
  LoggerVoidify local_5a1;
  int local_5a0;
  int local_59c;
  Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_> local_598;
  ulong local_568;
  size_t j_3;
  Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_> local_558;
  ulong local_528;
  size_t j_2;
  double elapsed;
  double end;
  double begin;
  BID<0UL> *local_500;
  __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
  local_4f8;
  __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
  local_4f0;
  reference local_4e8;
  BID *b;
  iterator __end3;
  iterator __begin3;
  vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *__range3;
  size_t num_total_blocks;
  size_t current_num_blocks_per_batch;
  stringstream local_4b0 [8];
  stringstream ss;
  ostream local_4a0 [376];
  ulong local_328;
  external_size_type offset;
  double ts_begin;
  size_t current_batch_size;
  striping alloc;
  size_t i;
  size_t j_1;
  size_t j;
  char *local_2d8;
  allocator local_2c9;
  string local_2c8;
  string local_2a8;
  allocator local_281;
  string local_280;
  string local_260;
  Logger local_240;
  LoggerVoidify local_c1;
  ulong local_c0;
  external_size_type total_size_write;
  external_size_type total_size_read;
  double total_time_write;
  double total_time_read;
  vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> bids;
  request_ptr *reqs;
  allocator<unsigned_int_*> local_69;
  undefined1 local_68 [8];
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> buffer;
  size_t num_blocks_per_batch;
  size_t block_size;
  bool do_write;
  ulong uStack_38;
  bool do_read;
  external_size_type endpos;
  string *optrw_local;
  size_t raw_block_size_local;
  size_t batch_size_local;
  external_size_type start_offset_local;
  external_size_type size_local;
  
  uStack_38 = start_offset + size;
  raw_block_size_local = batch_size;
  batch_size_local = start_offset;
  start_offset_local = size;
  if (size == 0) {
    uStack_38 = std::numeric_limits<unsigned_long>::max();
  }
  lVar7 = std::__cxx11::string::find((char)optrw,0x72);
  lVar8 = std::__cxx11::string::find((char)optrw,0x77);
  foxxll::singleton<foxxll::block_manager,_true>::get_instance();
  if (raw_block_size_local == 0) {
    this = foxxll::singleton<foxxll::config,_true>::get_instance();
    raw_block_size_local = foxxll::config::disks_number(this);
  }
  raw_block_size_local = raw_block_size * raw_block_size_local;
  ppuVar9 = (pointer)foxxll::div_ceil<unsigned_long,unsigned_long>
                               (raw_block_size_local,raw_block_size);
  raw_block_size_local = (long)ppuVar9 * raw_block_size;
  buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ppuVar9;
  std::allocator<unsigned_int_*>::allocator(&local_69);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_68,(size_type)ppuVar9,
             &local_69);
  std::allocator<unsigned_int_*>::~allocator(&local_69);
  ppuVar9 = buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  uVar10 = SUB168(auVar2 * ZEXT816(8),0);
  uVar19 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar19 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar19 = 0xffffffffffffffff;
  }
  puVar11 = (undefined8 *)operator_new__(uVar19);
  *puVar11 = ppuVar9;
  bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(puVar11 + 1);
  if (ppuVar9 != (pointer)0x0) {
    local_ab8 = bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::CountingPtr
                ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_ab8);
      local_ab8 = (pointer)&local_ab8->offset;
    } while (local_ab8 !=
             (pointer)(&(bids.
                         super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->storage + (long)ppuVar9
                      ));
  }
  std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::vector
            ((vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *)&total_time_read);
  total_time_write = 0.0;
  total_size_read = 0;
  total_size_write = 0;
  local_c0 = 0;
  tlx::Logger::Logger(&local_240);
  pLVar12 = tlx::Logger::operator<<(&local_240,(char (*) [15])"# Batch size: ");
  sVar1 = raw_block_size_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"B",&local_281);
  foxxll::add_IEC_binary_multiplier(&local_260,sVar1,&local_280);
  pLVar12 = tlx::Logger::operator<<(pLVar12,&local_260);
  pLVar12 = tlx::Logger::operator<<(pLVar12,(char (*) [3])0x1bd2df);
  pLVar12 = tlx::Logger::operator<<
                      (pLVar12,(unsigned_long *)
                               &buffer.
                                super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
  pLVar12 = tlx::Logger::operator<<(pLVar12,(char (*) [12])" blocks of ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"B",&local_2c9);
  foxxll::add_IEC_binary_multiplier(&local_2a8,raw_block_size,&local_2c8);
  pLVar12 = tlx::Logger::operator<<(pLVar12,&local_2a8);
  pLVar12 = tlx::Logger::operator<<(pLVar12,(char (*) [2])0x1beb19);
  pLVar12 = tlx::Logger::operator<<(pLVar12,(char (*) [8])" using ");
  foxxll::striping::striping((striping *)&j);
  local_2d8 = foxxll::striping::name();
  pLVar12 = tlx::Logger::operator<<(pLVar12,&local_2d8);
  tlx::LoggerVoidify::operator&(&local_c1,pLVar12);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  tlx::Logger::~Logger(&local_240);
  for (j_1 = 0; j_1 < buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage; j_1 = j_1 + 1) {
    puVar13 = (value_type)foxxll::aligned_alloc<4096ul>(raw_block_size,0);
    ppuVar14 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                         ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_68,j_1);
    *ppuVar14 = puVar13;
  }
  for (i = 0; i < buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage; i = i + 1) {
    for (alloc.diff_ = 0; alloc.diff_ < raw_block_size >> 2; alloc.diff_ = alloc.diff_ + 1) {
      iVar3 = (int)alloc.diff_;
      ppuVar14 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                           ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_68,i);
      (*ppuVar14)[alloc.diff_] = (int)i * (int)(raw_block_size >> 2) + iVar3;
    }
  }
  foxxll::striping::striping((striping *)&current_batch_size);
  offset = (external_size_type)foxxll::timestamp();
  for (local_328 = 0; local_328 < uStack_38; local_328 = (long)ts_begin + local_328) {
    std::__cxx11::stringstream::stringstream(local_4b0);
    current_num_blocks_per_batch = uStack_38 - local_328;
    pdVar15 = (double *)std::min<unsigned_long>(&raw_block_size_local,&current_num_blocks_per_batch)
    ;
    ts_begin = *pdVar15;
    count = foxxll::div_ceil<unsigned_long,unsigned_long>((unsigned_long)ts_begin,raw_block_size);
    __n = std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::size
                    ((vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *)
                     &total_time_read);
    std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::resize
              ((vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *)&total_time_read,
               __n + count);
    __end3 = std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::begin
                       ((vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *)
                        &total_time_read);
    b = (BID *)std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::end
                         ((vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *)
                          &total_time_read);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                                       *)&b), bVar6) {
      local_4e8 = __gnu_cxx::
                  __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                  ::operator*(&__end3);
      local_4e8->size = raw_block_size;
      __gnu_cxx::
      __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
      ::operator++(&__end3);
    }
    this_00 = foxxll::singleton<foxxll::block_manager,_true>::get_instance();
    local_4f8._M_current =
         (BID<0UL> *)
         std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::begin
                   ((vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *)&total_time_read
                   );
    local_4f0 = __gnu_cxx::
                __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                ::operator+(&local_4f8,__n);
    local_500 = (BID<0UL> *)
                std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::end
                          ((vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *)
                           &total_time_read);
    foxxll::block_manager::
    new_blocks<foxxll::striping,__gnu_cxx::__normal_iterator<foxxll::BID<0ul>*,std::vector<foxxll::BID<0ul>,std::allocator<foxxll::BID<0ul>>>>>
              (this_00,(striping *)&current_batch_size,local_4f0,
               (__normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                )local_500,0);
    if (local_328 < batch_size_local) {
      begin._4_4_ = 0xd;
    }
    else {
      if ((g_quiet & 1U) == 0) {
        poVar17 = std::operator<<(local_4a0,"Offset    ");
        begin._0_4_ = std::setw(7);
        poVar17 = std::operator<<(poVar17,begin._0_4_);
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,local_328 >> 0x14);
        poVar17 = std::operator<<(poVar17," MiB: ");
        std::ostream::operator<<(poVar17,std::fixed);
      }
      end = foxxll::timestamp();
      if (lVar8 == -1) {
        j_2 = 0;
      }
      else {
        for (local_528 = 0; local_528 < count; local_528 = local_528 + 1) {
          pvVar16 = std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::operator[]
                              ((vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *)
                               &total_time_read,__n + local_528);
          ppuVar14 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                               ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_68,
                                local_528);
          puVar13 = *ppuVar14;
          local_558.store_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_558.store_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_558.caller_ = (Caller)0x0;
          local_558.object_ptr_ = (void *)0x0;
          tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::Delegate(&local_558)
          ;
          foxxll::BID<0UL>::write
                    ((BID<0UL> *)&stack0xfffffffffffffad0,(int)pvVar16,puVar13,raw_block_size);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator=
                    ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                     (&(bids.
                        super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage)->storage + local_528),
                     (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                     &stack0xfffffffffffffad0);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr
                    ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                     &stack0xfffffffffffffad0);
          tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::~Delegate
                    (&local_558);
        }
        foxxll::wait_all((request_ptr *)
                         bids.
                         super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,count);
        elapsed = foxxll::timestamp();
        j_2 = (size_t)(elapsed - end);
        local_c0 = (long)ts_begin + local_c0;
        total_size_read = (external_size_type)((double)j_2 + (double)total_size_read);
      }
      if ((g_quiet & 1U) == 0) {
        j_3._4_4_ = std::setw(5);
        poVar17 = std::operator<<(local_4a0,j_3._4_4_);
        j_3._0_4_ = std::setprecision(1);
        poVar17 = std::operator<<(poVar17,j_3._0_4_);
        auVar21._8_4_ = (int)((ulong)ts_begin >> 0x20);
        auVar21._0_8_ = ts_begin;
        auVar21._12_4_ = 0x45300000;
        poVar17 = (ostream *)
                  std::ostream::operator<<
                            (poVar17,(((auVar21._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,SUB84(ts_begin,0)) -
                                      4503599627370496.0)) * 9.5367431640625e-07) / (double)j_2);
        std::operator<<(poVar17," MiB/s write, ");
      }
      end = foxxll::timestamp();
      if (lVar7 == -1) {
        j_2 = 0;
      }
      else {
        for (local_568 = 0; local_568 < count; local_568 = local_568 + 1) {
          pvVar16 = std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::operator[]
                              ((vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *)
                               &total_time_read,__n + local_568);
          ppuVar14 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                               ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_68,
                                local_568);
          puVar13 = *ppuVar14;
          local_598.store_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_598.store_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_598.caller_ = (Caller)0x0;
          local_598.object_ptr_ = (void *)0x0;
          tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::Delegate(&local_598)
          ;
          foxxll::BID<0UL>::read
                    ((BID<0UL> *)&stack0xfffffffffffffa90,(int)pvVar16,puVar13,raw_block_size);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator=
                    ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                     (&(bids.
                        super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage)->storage + local_568),
                     (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                     &stack0xfffffffffffffa90);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr
                    ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                     &stack0xfffffffffffffa90);
          tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::~Delegate
                    (&local_598);
        }
        foxxll::wait_all((request_ptr *)
                         bids.
                         super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,count);
        elapsed = foxxll::timestamp();
        j_2 = (size_t)(elapsed - end);
        total_size_write = (long)ts_begin + total_size_write;
        total_time_write = (double)j_2 + total_time_write;
      }
      if ((g_quiet & 1U) == 0) {
        local_59c = (int)std::setw(5);
        poVar17 = std::operator<<(local_4a0,(_Setw)local_59c);
        local_5a0 = (int)std::setprecision(1);
        poVar17 = std::operator<<(poVar17,(_Setprecision)local_5a0);
        auVar22._8_4_ = (int)((ulong)ts_begin >> 0x20);
        auVar22._0_8_ = ts_begin;
        auVar22._12_4_ = 0x45300000;
        poVar17 = (ostream *)
                  std::ostream::operator<<
                            (poVar17,(((auVar22._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,SUB84(ts_begin,0)) -
                                      4503599627370496.0)) * 9.5367431640625e-07) / (double)j_2);
        std::operator<<(poVar17," MiB/s read");
      }
      if ((g_quiet & 1U) == 0) {
        tlx::Logger::Logger(&local_720);
        std::__cxx11::stringstream::str();
        pLVar12 = tlx::Logger::operator<<
                            (&local_720,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ex);
        tlx::LoggerVoidify::operator&(&local_5a1,pLVar12);
        std::__cxx11::string::~string((string *)&ex);
        tlx::Logger::~Logger(&local_720);
      }
      dVar20 = foxxll::timestamp();
      if (dVar20 - (double)offset <= g_time_limit) {
        begin._4_4_ = 0;
      }
      else {
        begin._4_4_ = 0xb;
      }
    }
    std::__cxx11::stringstream::~stringstream(local_4b0);
    if ((begin._4_4_ != 0) && (begin._4_4_ == 0xb)) break;
  }
  tlx::Logger::Logger(&local_a50);
  pLVar12 = tlx::Logger::operator<<
                      (&local_a50,
                       (char (*) [95])
                       "=============================================================================================\n"
                      );
  pLVar12 = tlx::Logger::operator<<(pLVar12,(char (*) [16])"# Average over ");
  local_a54 = std::setw(7);
  pLVar12 = tlx::Logger::operator<<(pLVar12,&local_a54);
  local_a60 = local_c0 >> 0x14;
  pLVar12 = tlx::Logger::operator<<(pLVar12,&local_a60);
  pLVar12 = tlx::Logger::operator<<(pLVar12,(char (*) [7])" MiB: ");
  local_a64 = std::setw(5);
  pLVar12 = tlx::Logger::operator<<(pLVar12,&local_a64);
  local_a68 = std::setprecision(1);
  pLVar12 = tlx::Logger::operator<<(pLVar12,&local_a68);
  auVar23._8_4_ = (int)(local_c0 >> 0x20);
  auVar23._0_8_ = local_c0;
  auVar23._12_4_ = 0x45300000;
  local_a70 = (((auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_c0) - 4503599627370496.0)) *
              9.5367431640625e-07) / (double)total_size_read;
  pLVar12 = tlx::Logger::operator<<(pLVar12,&local_a70);
  pLVar12 = tlx::Logger::operator<<(pLVar12,(char (*) [15])" MiB/s write, ");
  local_a74 = std::setw(5);
  pLVar12 = tlx::Logger::operator<<(pLVar12,&local_a74);
  local_a78 = std::setprecision(1);
  pLVar12 = tlx::Logger::operator<<(pLVar12,&local_a78);
  auVar24._8_4_ = (int)(total_size_write >> 0x20);
  auVar24._0_8_ = total_size_write;
  auVar24._12_4_ = 0x45300000;
  j_4 = (size_t)((((auVar24._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)total_size_write) - 4503599627370496.0)) *
                 9.5367431640625e-07) / total_time_write);
  pLVar12 = tlx::Logger::operator<<(pLVar12,(double *)&j_4);
  pLVar12 = tlx::Logger::operator<<(pLVar12,(char (*) [12])" MiB/s read");
  tlx::LoggerVoidify::operator&(local_8d1,pLVar12);
  tlx::Logger::~Logger(&local_a50);
  poVar17 = std::operator<<((ostream *)&std::cout,"RESULT");
  pcVar18 = getenv("RESULT");
  if (pcVar18 == (char *)0x0) {
    local_cc0 = "";
  }
  else {
    local_cc0 = getenv("RESULT");
  }
  poVar17 = std::operator<<(poVar17,local_cc0);
  poVar17 = std::operator<<(poVar17," size=");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,start_offset_local);
  poVar17 = std::operator<<(poVar17," op=");
  poVar17 = std::operator<<(poVar17,(string *)optrw);
  poVar17 = std::operator<<(poVar17," block_size=");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,raw_block_size);
  poVar17 = std::operator<<(poVar17," batch_size=");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,raw_block_size_local / raw_block_size);
  poVar17 = std::operator<<(poVar17," offset=");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,batch_size_local);
  poVar17 = std::operator<<(poVar17," write_time=");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,(double)total_size_read);
  poVar17 = std::operator<<(poVar17," read_time=");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,total_time_write);
  poVar17 = std::operator<<(poVar17," write_size=");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,local_c0);
  poVar17 = std::operator<<(poVar17," read_size=");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,total_size_write);
  poVar17 = std::operator<<(poVar17," time=");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,(double)total_size_read + total_time_write);
  poVar17 = std::operator<<(poVar17," total_size=");
  this_01 = (void *)std::ostream::operator<<(poVar17,local_c0 + total_size_write);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  pBVar5 = bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    pBVar4 = bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + -1;
    sVar1 = bids.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[-1].size;
    this_02 = (pointer)(&(bids.
                          super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage)->storage + sVar1);
    while (pBVar5 != this_02) {
      this_02 = (pointer)&this_02[-1].size;
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr
                ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)this_02);
    }
    operator_delete__(&pBVar4->size,sVar1 * 8 + 8);
  }
  for (local_a88 = (pointer)0x0;
      local_a88 <
      buffer.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage; local_a88 = (pointer)((long)local_a88 + 1)) {
    ppuVar14 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                         ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_68,
                          (size_type)local_a88);
    foxxll::aligned_dealloc<4096ul>(*ppuVar14);
  }
  begin._4_4_ = 1;
  std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::~vector
            ((vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> *)&total_time_read);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::~vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_68);
  return 0;
}

Assistant:

int benchmark_disks_alloc(
    external_size_type size, external_size_type start_offset,
    size_t batch_size, const size_t raw_block_size,
    const std::string& optrw)
{
    external_size_type endpos = start_offset + size;

    if (size == 0)
        endpos = std::numeric_limits<external_size_type>::max();

    bool do_read = (optrw.find('r') != std::string::npos);
    bool do_write = (optrw.find('w') != std::string::npos);

    // initialize disk configuration
    foxxll::block_manager::get_instance();

    // construct block type

    const size_t block_size = raw_block_size / sizeof(uint32_t);

    using block_type = uint32_t *;
    using BID = foxxll::BID<0>;

    if (batch_size == 0)
        batch_size = foxxll::config::get_instance()->disks_number();

    // calculate total bytes processed in a batch
    batch_size = raw_block_size * batch_size;

    size_t num_blocks_per_batch = foxxll::div_ceil(batch_size, raw_block_size);
    batch_size = num_blocks_per_batch * raw_block_size;

    std::vector<block_type> buffer(num_blocks_per_batch);
    foxxll::request_ptr* reqs = new foxxll::request_ptr[num_blocks_per_batch];
    std::vector<BID> bids;
    double total_time_read = 0, total_time_write = 0;
    external_size_type total_size_read = 0, total_size_write = 0;

    LOG1 << "# Batch size: "
         << foxxll::add_IEC_binary_multiplier(batch_size, "B") << " ("
         << num_blocks_per_batch << " blocks of "
         << foxxll::add_IEC_binary_multiplier(raw_block_size, "B") << ")"
         << " using " << AllocStrategy().name();

    // allocate data blocks
    for (size_t j = 0; j < num_blocks_per_batch; ++j) {
        buffer[j] = reinterpret_cast<block_type>(
                foxxll::aligned_alloc<4096>(raw_block_size));
    }

    // touch data, so it is actually allocated
    for (size_t j = 0; j < num_blocks_per_batch; ++j) {
        for (size_t i = 0; i < block_size; ++i)
            buffer[j][i] = static_cast<uint32_t>(j * block_size + i);
    }

    try {
        AllocStrategy alloc;
        size_t current_batch_size;

        double ts_begin = timestamp();

        for (external_size_type offset = 0; offset < endpos; offset += current_batch_size)
        {
            std::stringstream ss;

            current_batch_size = static_cast<size_t>(
                    std::min<external_size_type>(batch_size, endpos - offset));
#if CHECK_AFTER_READ
            const size_t current_batch_size_int = current_batch_size / sizeof(uint32_t);
#endif
            const size_t current_num_blocks_per_batch =
                foxxll::div_ceil(current_batch_size, raw_block_size);

            size_t num_total_blocks = bids.size();
            bids.resize(num_total_blocks + current_num_blocks_per_batch);

            // fill in block size of BID<0> variable blocks
            for (BID& b : bids) b.size = raw_block_size;

            foxxll::block_manager::get_instance()->new_blocks(
                alloc, bids.begin() + num_total_blocks, bids.end()
            );

            if (offset < start_offset)
                continue;

            if (!g_quiet)
                ss << "Offset    " << std::setw(7) << (offset / MiB) << " MiB: "
                   << std::fixed;

            double begin = timestamp(), end, elapsed;

            if (do_write)
            {
                for (size_t j = 0; j < current_num_blocks_per_batch; j++)
                    reqs[j] = bids[num_total_blocks + j].write(buffer[j], raw_block_size);

                wait_all(reqs, current_num_blocks_per_batch);

                end = timestamp();
                elapsed = end - begin;
                total_size_write += current_batch_size;
                total_time_write += elapsed;
            }
            else
                elapsed = 0.0;

            if (!g_quiet)
                ss << std::setw(5) << std::setprecision(1)
                   << (double(current_batch_size) / MiB / elapsed)
                   << " MiB/s write, ";

            begin = timestamp();

            if (do_read)
            {
                for (size_t j = 0; j < current_num_blocks_per_batch; j++)
                    reqs[j] = bids[num_total_blocks + j].read(
                            buffer[j], raw_block_size
                        );

                wait_all(reqs, current_num_blocks_per_batch);

                end = timestamp();
                elapsed = end - begin;
                total_size_read += current_batch_size;
                total_time_read += elapsed;
            }
            else
                elapsed = 0.0;

            if (!g_quiet)
                ss << std::setw(5) << std::setprecision(1)
                   << (double(current_batch_size) / MiB / elapsed)
                   << " MiB/s read";

            if (!g_quiet)
                LOG1 << ss.str();

#if CHECK_AFTER_READ
            for (size_t j = 0; j < current_num_blocks_per_batch; j++)
            {
                for (size_t i = 0; i < block_size; i++)
                {
                    if (buffer[j][i] != static_cast<uint32_t>(j * block_size + i))
                    {
                        size_t ibuf = i / current_batch_size_int;
                        size_t pos = i % current_batch_size_int;

                        LOG1 << "Error on disk " << ibuf << " position "
                             << std::hex << std::setw(8)
                             << offset + pos * sizeof(uint32_t)
                             << "  got: "
                             << std::hex << std::setw(8)
                             << buffer[j][i]
                             << " wanted: "
                             << std::hex << std::setw(8)
                             << (j * block_size + i)
                             << std::dec << std::endl;

                        i = (ibuf + 1) * current_batch_size_int; // jump to next
                    }
                }
            }
#endif
            if (timestamp() - ts_begin > g_time_limit)
                break;
        }
    }
    catch (const std::exception& ex)
    {
        LOG1 << ex.what();
    }

    LOG1 << "=============================================================================================\n"
         << "# Average over " << std::setw(7) << total_size_write / MiB << " MiB: "
         << std::setw(5) << std::setprecision(1)
         << (double(total_size_write) / MiB / total_time_write) << " MiB/s write, "
         << std::setw(5) << std::setprecision(1)
         << (double(total_size_read) / MiB / total_time_read) << " MiB/s read";

    std::cout << "RESULT"
              << (getenv("RESULT") ? getenv("RESULT") : "")
              << " size=" << size
              << " op=" << optrw
              << " block_size=" << raw_block_size
              << " batch_size=" << batch_size / raw_block_size
              << " offset=" << start_offset
              << " write_time=" << total_time_write
              << " read_time=" << total_time_read
              << " write_size=" << total_size_write
              << " read_size=" << total_size_read
              << " time=" << (total_time_write + total_time_read)
              << " total_size=" << (total_size_write + total_size_read)
              << std::endl;

    delete[] reqs;

    for (size_t j = 0; j < num_blocks_per_batch; ++j)
        foxxll::aligned_dealloc<4096>(buffer[j]);

    return 0;
}